

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall flatbuffers::go::GoGenerator::~GoGenerator(GoGenerator *this)

{
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003f3608;
  std::
  _Rb_tree<const_flatbuffers::Definition_*,_const_flatbuffers::Definition_*,_std::_Identity<const_flatbuffers::Definition_*>,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
  ::~_Rb_tree(&(this->tracked_imported_namespaces_)._M_t);
  (this->namer_).super_Namer._vptr_Namer = (_func_int **)&PTR__Namer_003f2d00;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->namer_).super_Namer.keywords_._M_t);
  Namer::Config::~Config(&(this->namer_).super_Namer.config_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->go_namespace_).components);
  BaseGenerator::~BaseGenerator(&this->super_BaseGenerator);
  operator_delete(this,0x268);
  return;
}

Assistant:

GoGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name, const std::string &go_namespace)
      : BaseGenerator(parser, path, file_name, "" /* not used*/,
                      "" /* not used */, "go"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(GoDefaultConfig(), parser.opts, path),
               GoKeywords()) {
    std::istringstream iss(go_namespace);
    std::string component;
    while (std::getline(iss, component, '.')) {
      go_namespace_.components.push_back(component);
    }
  }